

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O3

Stream * rw::d3d9::writeNativeData
                   (Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  short *psVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  void *vertexBuffer;
  bool bVar5;
  int32 iVar6;
  undefined4 uVar7;
  undefined4 *puVar8;
  uint16 *puVar9;
  uint8 *puVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  uint32 val;
  VertexElement elements [12];
  undefined1 local_98 [104];
  
  writeChunkHeader(stream,1,len + -0xc);
  if ((*(int **)((long)object + 0x98) != (int *)0x0) && (**(int **)((long)object + 0x98) == 9)) {
    Stream::writeU32(stream,9);
    lVar4 = *(long *)((long)object + 0x98);
    lVar3 = (ulong)*(ushort *)(*(long *)((long)object + 0x90) + 4) * 0x24 + 0x40;
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 254"
    ;
    puVar8 = (undefined4 *)(*DAT_00149858)(lVar3,0x1000f);
    Stream::writeI32(stream,(int32)lVar3);
    *puVar8 = *(undefined4 *)(lVar4 + 4);
    puVar8[1] = *(undefined4 *)(lVar4 + 8);
    puVar8[3] = *(undefined4 *)(lVar4 + 0x18);
    puVar8[0xc] = *(undefined4 *)(lVar4 + 0x50);
    puVar8[0xe] = *(undefined4 *)(lVar4 + 0x60);
    puVar8[0xf] = *(undefined4 *)(lVar4 + 100);
    if (*(int *)(lVar4 + 8) != 0) {
      puVar15 = *(undefined4 **)(lVar4 + 0x68);
      puVar16 = puVar8 + 0x10;
      uVar12 = 0;
      do {
        *puVar16 = *puVar15;
        puVar16[1] = puVar15[1];
        iVar6 = MaterialList::findIndex
                          ((MaterialList *)((long)object + 0x80),*(Material **)(puVar15 + 2));
        puVar16[2] = iVar6;
        puVar16[3] = puVar15[4];
        puVar16[4] = 0;
        puVar16[5] = puVar15[8];
        puVar16[6] = puVar15[9];
        puVar16[7] = puVar15[10];
        puVar16[8] = puVar15[0xb];
        puVar16 = puVar16 + 9;
        puVar15 = puVar15 + 0xc;
        uVar12 = uVar12 + 1;
      } while (uVar12 < *(uint *)(lVar4 + 8));
    }
    (*stream->_vptr_Stream[3])(stream,puVar8,lVar3);
    val = 0;
    uVar13 = 0;
    do {
      val = val + 1;
      psVar1 = (short *)((long)*(void **)(lVar4 + 0x58) + uVar13);
      uVar13 = uVar13 + 8;
    } while (*psVar1 != 0xff);
    memcpy(local_98,*(void **)(lVar4 + 0x58),uVar13 & 0x7fffffff8);
    Stream::writeU32(stream,val);
    (*stream->_vptr_Stream[3])(stream,local_98,uVar13 & 0xffffffff);
    puVar9 = d3d::lockIndices(*(void **)(lVar4 + 0x10),0,0,0);
    (*stream->_vptr_Stream[3])(stream,puVar9,(ulong)(uint)(*(int *)(lVar4 + 0x60) * 2));
    d3d::unlockIndices(*(void **)(lVar4 + 0x10));
    lVar3 = lVar4 + 0x20;
    lVar11 = 0;
    bVar5 = true;
    do {
      bVar14 = bVar5;
      uVar7 = 0xbadeaffe;
      if (*(long *)(lVar3 + lVar11 * 0x18) == 0) {
        uVar7 = 0;
      }
      *puVar8 = uVar7;
      puVar8[1] = *(undefined4 *)(lVar4 + 0x28 + lVar11 * 0x18);
      puVar8[2] = *(undefined4 *)(lVar4 + 0x2c + lVar11 * 0x18);
      *(undefined2 *)(puVar8 + 3) = *(undefined2 *)(lVar4 + 0x30 + lVar11 * 0x18);
      *(undefined1 *)((long)puVar8 + 0xe) = *(undefined1 *)(lVar4 + 0x32 + lVar11 * 0x18);
      *(undefined1 *)((long)puVar8 + 0xf) = *(undefined1 *)(lVar4 + 0x33 + lVar11 * 0x18);
      (*stream->_vptr_Stream[3])(stream,puVar8,0x10);
      vertexBuffer = *(void **)(lVar3 + lVar11 * 0x18);
      if (vertexBuffer != (void *)0x0) {
        puVar2 = (undefined8 *)(lVar3 + lVar11 * 0x18);
        puVar10 = d3d::lockVertices(vertexBuffer,0,0,0);
        (*stream->_vptr_Stream[3])
                  (stream,puVar10,
                   (ulong)(uint)(*(int *)(lVar4 + 100) * *(int *)((long)puVar2 + 0xc)));
        d3d::unlockVertices((void *)*puVar2);
      }
      lVar11 = 1;
      bVar5 = false;
    } while (bVar14);
    (*DAT_00149850)(puVar8);
  }
  return stream;
}

Assistant:

Stream*
writeNativeData(Stream *stream, int32 len, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	writeChunkHeader(stream, ID_STRUCT, len-12);
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D9)
		return stream;
	stream->writeU32(PLATFORM_D3D9);
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	int32 size = 64 + geometry->meshHeader->numMeshes*36;
	uint8 *data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_GEOMETRY);
	stream->writeI32(size);

	uint8 *p = data;
	*(uint32*)p = header->serialNumber; p += 4;
	*(uint32*)p = header->numMeshes; p += 4;
	p += 4;		// skip index buffer
	*(uint32*)p = header->primType; p += 4;
	p += 16*2;	// skip vertex streams, they're repeated with the vertex buffers
	*(bool32*)p = header->useOffsets; p += 4;
	p += 4;		// skip vertex declaration
	*(uint32*)p = header->totalNumIndex; p += 4;
	*(uint32*)p = header->totalNumVertex; p += 4;

	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		*(uint32*)p = inst->numIndex; p += 4;
		*(uint32*)p = inst->minVert; p += 4;
		int32 matid = geometry->matList.findIndex(inst->material);
		*(int32*)p = matid; p += 4;
		*(bool32*)p = inst->vertexAlpha; p += 4;
		*(uint32*)p = 0; p += 4;		// vertex shader
		*(uint32*)p = inst->baseIndex; p += 4;	// not used but meh...
		*(uint32*)p = inst->numVertices; p += 4;
		*(uint32*)p = inst->startIndex; p += 4;
		*(uint32*)p = inst->numPrimitives; p += 4;
		inst++;
	}
	stream->write8(data, size);

	VertexElement elements[NUMDECLELT];
	uint32 numElt = getDeclaration(header->vertexDeclaration, elements);
	stream->writeU32(numElt);
	stream->write8(elements, 8*numElt);

	uint16 *indices = lockIndices(header->indexBuffer, 0, 0, 0);
	stream->write8(indices, 2*header->totalNumIndex);
	unlockIndices(header->indexBuffer);

	VertexStream *s;
	for(int i = 0; i < 2; i++){
		s = &header->vertexStream[i];
		p = data;
		*(uint32*)p = s->vertexBuffer ? 0xbadeaffe : 0; p += 4;
		*(uint32*)p = s->offset; p += 4;
		*(uint32*)p = s->stride; p += 4;
		*(uint16*)p = s->geometryFlags; p += 2;
		*p++ = s->managed;
		*p++ = s->dynamicLock;
		stream->write8(data, 16);

		if(s->vertexBuffer == nil)
			continue;
		uint8 *verts = lockVertices(s->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
		stream->write8(verts, s->stride*header->totalNumVertex);
		unlockVertices(s->vertexBuffer);
	}

	rwFree(data);
	return stream;
}